

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

void __thiscall rsg::TexLookup::~TexLookup(TexLookup *this)

{
  TexLookup *this_local;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__TexLookup_015ce490;
  if (this->m_coordExpr != (Expression *)0x0) {
    (*this->m_coordExpr->_vptr_Expression[1])();
  }
  if (this->m_lodBiasExpr != (Expression *)0x0) {
    (*this->m_lodBiasExpr->_vptr_Expression[1])();
  }
  ValueStorage<64>::~ValueStorage(&this->m_value);
  VariableType::~VariableType(&this->m_valueType);
  Expression::~Expression(&this->super_Expression);
  return;
}

Assistant:

TexLookup::~TexLookup (void)
{
	delete m_coordExpr;
	delete m_lodBiasExpr;
}